

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall Logger::StructuredFileOutputSink::flushLastMessage(StructuredFileOutputSink *this)

{
  uint uVar1;
  uint uVar2;
  FILE *pFVar3;
  bool bVar4;
  char *pcVar5;
  String local_30;
  String local_20;
  StructuredFileOutputSink *local_10;
  StructuredFileOutputSink *this_local;
  
  local_10 = this;
  bVar4 = Bstrlib::String::operator!(&this->lastMessage);
  if (!bVar4) {
    if (this->lastMessageCount < 2) {
      pFVar3 = (FILE *)this->file;
      uVar1 = this->lastTime;
      uVar2 = this->lastFlags;
      pcVar5 = Bstrlib::String::operator_cast_to_char_(&this->lastMessage);
      fprintf(pFVar3,"[%08X][%08X] %s\n",(ulong)uVar1,(ulong)uVar2,pcVar5);
    }
    else {
      pFVar3 = (FILE *)this->file;
      uVar1 = this->lastTime;
      uVar2 = this->lastFlags;
      Bstrlib::String::String(&local_30,"\n");
      Bstrlib::String::upToLast(&local_20,&this->lastMessage,SUB81(&local_30,0));
      pcVar5 = Bstrlib::String::operator_cast_to_char_(&local_20);
      fprintf(pFVar3,"[%08X][%08X] %s (last message repeated %d times)\n",(ulong)uVar1,(ulong)uVar2,
              pcVar5,(ulong)(uint)this->lastMessageCount);
      Bstrlib::String::~String(&local_20);
      Bstrlib::String::~String(&local_30);
    }
    if ((this->lastFlags & 1) != 0) {
      fflush((FILE *)this->file);
    }
  }
  return;
}

Assistant:

void StructuredFileOutputSink::flushLastMessage()
    {
        if (!lastMessage) return;

        if (lastMessageCount > 1)
            fprintf(file, "[%08X][%08X] %s (last message repeated %d times)" ENDOFLINE, lastTime, lastFlags, (const char*)lastMessage.upToLast("\n"), lastMessageCount);
        else
            fprintf(file, "[%08X][%08X] %s" ENDOFLINE, lastTime, lastFlags, (const char*)lastMessage);

        if ((lastFlags & Error) != 0) fflush(file); // Errors messages should be flushed as soon as possible
    }